

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkMiterCofactor(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_428;
  int i;
  int Value;
  Abc_Obj_t *pOutput1;
  Abc_Obj_t *pRoot;
  Abc_Ntk_t *pNtkMiter;
  char Buffer [1000];
  Vec_Int_t *vPiValues_local;
  Abc_Ntk_t *pNtk_local;
  
  Buffer._992_8_ = vPiValues;
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x1c6,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
  }
  iVar1 = Abc_NtkCoNum(pNtk);
  if (iVar1 == 1) {
    iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk);
    if (iVar1 == 0) {
      __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                    ,0x1c8,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
    }
    pNtk_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    sprintf((char *)&pNtkMiter,"%s_miter",pNtk->pName);
    pcVar2 = Extra_UtilStrsav((char *)&pNtkMiter);
    pNtk_local->pName = pcVar2;
    pAVar3 = Abc_NtkCo(pNtk,0);
    Abc_NtkMiterPrepare(pNtk,pNtk,pNtk_local,1,-1,0);
    local_428 = 0;
    do {
      iVar1 = Vec_IntSize((Vec_Int_t *)Buffer._992_8_);
      if (iVar1 <= local_428) {
        Abc_NtkMiterAddCone(pNtk,pNtk_local,pAVar3);
        pAVar5 = Abc_ObjFanin0(pAVar3);
        pAVar5 = (pAVar5->field_6).pCopy;
        iVar1 = Abc_ObjFaninC0(pAVar3);
        pAVar3 = Abc_ObjNotCond(pAVar5,iVar1);
        pAVar5 = Abc_NtkPo(pNtk_local,0);
        Abc_ObjAddFanin(pAVar5,pAVar3);
        iVar1 = Abc_NtkCheck(pNtk_local);
        if (iVar1 == 0) {
          printf("Abc_NtkMiterCofactor: The network check has failed.\n");
          Abc_NtkDelete(pNtk_local);
          pNtk_local = (Abc_Ntk_t *)0x0;
        }
        return pNtk_local;
      }
      iVar1 = Vec_IntEntry((Vec_Int_t *)Buffer._992_8_,local_428);
      if (iVar1 != -1) {
        if (iVar1 == 0) {
          pAVar5 = Abc_AigConst1(pNtk_local);
          pAVar5 = Abc_ObjNot(pAVar5);
          pAVar4 = Abc_NtkCi(pNtk,local_428);
          (pAVar4->field_6).pCopy = pAVar5;
        }
        else {
          if (iVar1 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                          ,0x1e3,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
          }
          pAVar5 = Abc_AigConst1(pNtk_local);
          pAVar4 = Abc_NtkCi(pNtk,local_428);
          (pAVar4->field_6).pCopy = pAVar5;
        }
      }
      local_428 = local_428 + 1;
    } while( true );
  }
  __assert_fail("1 == Abc_NtkCoNum(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                ,0x1c7,"Abc_Ntk_t *Abc_NtkMiterCofactor(Abc_Ntk_t *, Vec_Int_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterCofactor( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pRoot, * pOutput1;
    int Value, i;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( 1 == Abc_NtkCoNum(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_miter", pNtk->pName );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    // get the root output
    pRoot = Abc_NtkCo( pNtk, 0 );

    // perform strashing
    Abc_NtkMiterPrepare( pNtk, pNtk, pNtkMiter, 1, -1, 0 );
    // set the first cofactor
    Vec_IntForEachEntry( vPiValues, Value, i )
    {
        if ( Value == -1 )
            continue;
        if ( Value == 0 )
        {
            Abc_NtkCi(pNtk, i)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
            continue;
        }
        if ( Value == 1 )
        {
            Abc_NtkCi(pNtk, i)->pCopy = Abc_AigConst1(pNtkMiter);
            continue;
        }
        assert( 0 );
    }
    // add the first cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );

    // save the output
    pOutput1 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot)->pCopy, Abc_ObjFaninC0(pRoot) );

    // create the miter of the two outputs
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pOutput1 );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiterCofactor: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}